

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_img_decompress(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  char cVar1;
  undefined1 status_00 [8];
  int iVar2;
  void *__ptr;
  long lVar3;
  long lVar4;
  int datatype;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  size_t __size;
  long lVar10;
  fitsfile *infptr_00;
  long lVar11;
  double *nulval;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  FITSfile *pFVar15;
  int local_388;
  float fnulval;
  undefined1 local_380 [8];
  int local_378;
  int local_374;
  int local_370;
  int local_36c;
  fitsfile *local_368;
  undefined8 local_360;
  double dnulval;
  int local_350;
  int local_34c;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  fitsfile *local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long ltile [6];
  long ftile [6];
  long tilesize [6];
  long naxis [6];
  long rowdim [6];
  long tlpixel [6];
  long tfpixel [6];
  LONGLONG lpixel [6];
  LONGLONG fpixel [6];
  
  iVar2 = fits_img_decompress_header(infptr,outfptr,status);
  if (0 < iVar2) goto LAB_001c3aad;
  ffrdef(outfptr,status);
  ffpscl(outfptr,1.0,0.0,status);
  local_380 = (undefined1  [8])status;
  ffpscl(infptr,1.0,0.0,status);
  status = (int *)local_380;
  pFVar15 = infptr->Fptr;
  iVar2 = pFVar15->zbitpix;
  local_388 = 1;
  if (iVar2 == -0x40) {
    pdVar14 = (double *)((long)&dnulval + 1);
    pdVar9 = (double *)((long)&dnulval + 3);
    pdVar12 = (double *)((long)&dnulval + 7);
    dnulval = -9.1191291391491e-36;
    nulval = &dnulval;
    local_360 = 0x52;
  }
  else {
    pdVar14 = (double *)((long)&fnulval + 1);
    pdVar9 = (double *)((long)&fnulval + 3);
    pdVar12 = (double *)(local_380 + 3);
    nulval = (double *)&fnulval;
    if (iVar2 == -0x20) {
      fnulval = -9.11912e-36;
      local_360 = 0x2a;
    }
    else {
      local_388 = 0;
      if (iVar2 == 8) {
        local_360 = 0xb;
      }
      else if (iVar2 == 0x20) {
        local_360 = 0x1f;
      }
      else if (iVar2 == 0x10) {
        local_360 = 0x15;
      }
      else {
        local_360 = 0;
        local_388 = 0;
      }
    }
  }
  uVar7 = 0;
  uVar5 = (ulong)(uint)pFVar15->zndim;
  if (pFVar15->zndim < 1) {
    uVar5 = uVar7;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    fpixel[uVar7] = 1;
    lpixel[uVar7] = pFVar15->znaxis[uVar7];
  }
  if (0 < *(int *)local_380) goto LAB_001c3aad;
  local_368 = infptr;
  local_330 = outfptr;
  iVar2 = fits_is_compressed_image(infptr,(int *)local_380);
  if (iVar2 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_read_compressed_img)");
    *status = 0x19e;
    goto LAB_001c3aad;
  }
  iVar2 = (int)local_360;
  if (iVar2 == 0x14) {
    pFVar15 = local_368->Fptr;
LAB_001c3b9b:
    __ptr = malloc(pFVar15->maxtilelen * 2);
    cVar1 = *(char *)nulval;
joined_r0x001c3c03:
    if (cVar1 == '\0') {
LAB_001c3c2b:
      if (*(char *)pdVar14 == '\0') {
        local_388 = 0;
      }
    }
  }
  else if (iVar2 == 0x52) {
    pFVar15 = local_368->Fptr;
    __ptr = malloc(pFVar15->maxtilelen << 3);
    if (((((*(char *)nulval == '\0') && (*(char *)((long)nulval + 1) == '\0')) &&
         (*(char *)((long)nulval + 2) == '\0')) &&
        ((*(char *)((long)nulval + 3) == '\0' && (*(char *)((long)nulval + 4) == '\0')))) &&
       (*(char *)((long)nulval + 5) == '\0')) {
      cVar1 = *(char *)((long)nulval + 6);
      pdVar14 = pdVar12;
      goto joined_r0x001c3c03;
    }
  }
  else {
    if ((iVar2 != 0x1e) && (iVar2 != 0x1f)) {
      if ((iVar2 == 0x28) || (iVar2 == 0x29)) {
        pFVar15 = local_368->Fptr;
        __size = pFVar15->maxtilelen << 3;
        goto LAB_001c3b60;
      }
      if (iVar2 == 0x2a) goto LAB_001c3b40;
      if (iVar2 == 0x15) {
        pFVar15 = local_368->Fptr;
        goto LAB_001c3b9b;
      }
      if (1 < iVar2 - 0xbU) {
        ffpmsg("unsupported datatype for uncompressing image");
        *(int *)local_380 = 0x19a;
        status = (int *)local_380;
        goto LAB_001c3aad;
      }
      pFVar15 = local_368->Fptr;
      __ptr = malloc(pFVar15->maxtilelen);
      pdVar14 = nulval;
      goto LAB_001c3c2b;
    }
LAB_001c3b40:
    pFVar15 = local_368->Fptr;
    __size = pFVar15->maxtilelen << 2;
LAB_001c3b60:
    __ptr = malloc(__size);
    if ((*(char *)nulval == '\0') && (*(char *)((long)nulval + 1) == '\0')) {
      cVar1 = *(char *)((long)nulval + 2);
      pdVar14 = pdVar9;
      goto joined_r0x001c3c03;
    }
  }
  status_00 = local_380;
  if (__ptr == (void *)0x0) {
    ffpmsg("Out of memory (fits_read_compress_img)");
    *(int *)local_380 = 0x71;
    status = (int *)local_380;
  }
  else {
    lVar11 = 1;
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      naxis[lVar3] = 1;
      tilesize[lVar3] = 1;
      ftile[lVar3] = 1;
      ltile[lVar3] = 1;
      rowdim[lVar3] = 1;
    }
    uVar7 = 0;
    uVar5 = (ulong)(uint)pFVar15->zndim;
    if (pFVar15->zndim < 1) {
      uVar5 = uVar7;
    }
    for (; uVar5 * 8 != uVar7; uVar7 = uVar7 + 8) {
      lVar3 = *(long *)((long)fpixel + uVar7);
      lVar4 = *(long *)((long)lpixel + uVar7);
      lVar8 = lVar4;
      if (lVar3 < lVar4) {
        lVar8 = lVar3;
      }
      lVar10 = *(long *)((long)pFVar15->znaxis + uVar7);
      *(long *)((long)naxis + uVar7) = lVar10;
      if (lVar8 < 1) {
        free(__ptr);
        *(int *)local_380 = 0x141;
        status = (int *)local_380;
        goto LAB_001c3aad;
      }
      if (lVar4 < lVar3) {
        lVar4 = lVar3;
      }
      lVar3 = *(long *)((long)pFVar15->tilesize + uVar7);
      *(long *)((long)tilesize + uVar7) = lVar3;
      lVar10 = (lVar10 + -1) / lVar3 + 1;
      *(long *)((long)ftile + uVar7) = (lVar8 + -1) / lVar3 + 1;
      lVar3 = (lVar4 + -1) / lVar3 + 1;
      if (lVar10 <= lVar3) {
        lVar3 = lVar10;
      }
      *(long *)((long)ltile + uVar7) = lVar3;
      *(long *)((long)rowdim + uVar7) = lVar11;
      lVar11 = lVar11 * lVar10;
    }
    local_350 = (int)rowdim[5];
    local_310 = ftile[4];
    local_34c = (int)rowdim[4];
    local_2e8 = ftile[3];
    local_348 = (int)rowdim[3];
    local_2b8 = ftile[2];
    local_344 = (int)rowdim[2];
    local_288 = ftile[1];
    local_340 = (int)rowdim[1];
    local_378 = ((int)ftile[2] + -1) * (int)rowdim[2] + ((int)ftile[3] + -1) * (int)rowdim[3] +
                ((int)ftile[4] + -1) * (int)rowdim[4] + ((int)ftile[5] + -1) * (int)rowdim[5] +
                ((int)ftile[1] + -1) * (int)rowdim[1] + (int)ftile[0];
    local_248 = ftile[0] * tilesize[0];
    local_240 = ftile[0];
    local_218 = tilesize[0];
    local_250 = (ftile[0] + -1) * tilesize[0];
    local_258 = -local_250;
    local_250 = local_250 + 1;
    local_308 = ltile[5];
    local_318 = tilesize[5];
    local_320 = naxis[5];
    local_2d8 = ltile[4];
    local_2f0 = tilesize[4];
    local_2f8 = naxis[4];
    local_2a8 = ltile[3];
    local_2c0 = tilesize[3];
    local_2c8 = naxis[3];
    local_278 = ltile[2];
    local_290 = tilesize[2];
    local_298 = naxis[2];
    local_208 = ltile[0];
    local_230 = ltile[1];
    local_260 = tilesize[1];
    local_268 = naxis[1];
    lVar11 = 1;
    local_220 = naxis[0];
    uVar6 = local_360;
    infptr_00 = local_368;
    while (ftile[5] <= local_308) {
      local_2e0 = (ftile[5] + -1) * local_318;
      tfpixel[5] = local_2e0 + 1;
      tlpixel[5] = ftile[5] * local_318;
      if (local_320 <= ftile[5] * local_318) {
        tlpixel[5] = local_320;
      }
      local_2e0 = tlpixel[5] - local_2e0;
      local_374 = local_378;
      lVar3 = local_310;
      local_300 = ftile[5];
      while (lVar3 <= local_2d8) {
        lVar4 = (lVar3 + -1) * local_2f0;
        tfpixel[4] = lVar4 + 1;
        tlpixel[4] = lVar3 * local_2f0;
        if (local_2f8 <= lVar3 * local_2f0) {
          tlpixel[4] = local_2f8;
        }
        local_2b0 = (tlpixel[4] - lVar4) * local_2e0;
        local_370 = local_374;
        lVar4 = local_2e8;
        local_2d0 = lVar3;
        while (lVar4 <= local_2a8) {
          lVar3 = (lVar4 + -1) * local_2c0;
          tfpixel[3] = lVar3 + 1;
          tlpixel[3] = lVar4 * local_2c0;
          if (local_2c8 <= lVar4 * local_2c0) {
            tlpixel[3] = local_2c8;
          }
          local_280 = (tlpixel[3] - lVar3) * local_2b0;
          local_36c = local_370;
          lVar3 = local_2b8;
          local_2a0 = lVar4;
          while (lVar3 <= local_278) {
            lVar4 = (lVar3 + -1) * local_290;
            tfpixel[2] = lVar4 + 1;
            tlpixel[2] = lVar3 * local_290;
            if (local_298 <= lVar3 * local_290) {
              tlpixel[2] = local_298;
            }
            local_238 = (tlpixel[2] - lVar4) * local_280;
            lVar4 = local_288;
            iVar2 = local_36c;
            local_270 = lVar3;
            while (lVar4 <= local_230) {
              lVar3 = (lVar4 + -1) * local_260;
              tfpixel[1] = lVar3 + 1;
              tlpixel[1] = lVar4 * local_260;
              if (local_268 <= lVar4 * local_260) {
                tlpixel[1] = local_268;
              }
              local_210 = (tlpixel[1] - lVar3) * local_238;
              lVar3 = local_250;
              lVar8 = local_258;
              lVar10 = local_240;
              lVar13 = local_248;
              local_33c = iVar2;
              local_228 = lVar4;
              while( true ) {
                lVar4 = lVar13;
                if (naxis[0] < lVar13) {
                  lVar4 = naxis[0];
                }
                if (local_208 < lVar10) break;
                tlpixel[0] = naxis[0];
                if (lVar13 < naxis[0]) {
                  tlpixel[0] = lVar13;
                }
                lVar4 = (lVar4 + lVar8) * local_210;
                datatype = (int)uVar6;
                local_338 = iVar2;
                local_328 = lVar11;
                local_200 = lVar10;
                local_1f8 = lVar8;
                local_1f0 = lVar3;
                tfpixel[0] = lVar3;
                imcomp_decompress_tile
                          (infptr_00,iVar2,(int)lVar4,datatype,local_388,nulval,__ptr,(char *)0x0,
                           &local_334,(int *)status_00);
                lVar11 = local_328;
                if (local_334 == 0) {
                  ffpss(local_330,datatype,tfpixel,tlpixel,__ptr,(int *)status_00);
                  lVar11 = local_328;
                }
                else {
                  ffppn(local_330,datatype,local_328,lVar4,__ptr,nulval,(int *)status_00);
                }
                lVar11 = lVar11 + lVar4;
                lVar10 = local_200 + 1;
                iVar2 = local_338 + 1;
                lVar13 = lVar13 + local_218;
                lVar8 = local_1f8 - local_218;
                lVar3 = local_1f0 + local_218;
                uVar6 = local_360;
                infptr_00 = local_368;
                naxis[0] = local_220;
              }
              iVar2 = local_33c + local_340;
              lVar4 = local_228 + 1;
            }
            local_36c = local_36c + local_344;
            lVar3 = local_270 + 1;
          }
          local_370 = local_370 + local_348;
          lVar4 = local_2a0 + 1;
        }
        local_374 = local_374 + local_34c;
        lVar3 = local_2d0 + 1;
      }
      local_378 = local_378 + local_350;
      ftile[5] = local_300 + 1;
    }
    free(__ptr);
    status = (int *)local_380;
  }
LAB_001c3aad:
  return *status;
}

Assistant:

int fits_img_decompress (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  This routine decompresses the whole image and writes it to the output file.
*/

{
    int ii, datatype = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (fits_img_decompress_header(infptr, outfptr, status) > 0)
    {
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }

    /* uncompress the input image and write to output image, one tile at a time */

    fits_read_write_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, &anynul, outfptr, status);

    return (*status);
}